

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall enact::Lexer::skipWhitespace(Lexer *this)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  line_t lVar6;
  ulong uVar7;
  int iVar8;
  
  pcVar2 = (this->m_source)._M_dataplus._M_p;
  lVar6 = this->m_line;
  iVar8 = *(int *)&this->m_col;
  sVar4 = this->m_current;
  do {
    iVar8 = iVar8 + 1;
    sVar5 = sVar4 + 1;
    bVar1 = pcVar2[sVar4];
    if (bVar1 < 0xd) {
      if (bVar1 != 9) {
        if (bVar1 != 10) {
          return;
        }
        lVar6 = lVar6 + 1;
        this->m_line = lVar6;
      }
    }
    else if ((bVar1 != 0xd) && (bVar1 != 0x20)) {
      if ((bVar1 == 0x2f) && (pcVar2[sVar5] == '/')) {
        uVar3 = (this->m_source)._M_string_length;
        uVar7 = this->m_current;
        if (uVar7 < uVar3 && pcVar2[uVar7] != '\n') {
          iVar8 = *(int *)&this->m_col;
          do {
            iVar8 = iVar8 + 1;
            uVar7 = uVar7 + 1;
            this->m_col = (col_t)iVar8;
            this->m_current = uVar7;
            if (pcVar2[uVar7] == '\n') {
              return;
            }
          } while (uVar7 < uVar3);
        }
      }
      return;
    }
    this->m_col = (col_t)iVar8;
    this->m_current = sVar5;
    sVar4 = sVar5;
  } while( true );
}

Assistant:

void Lexer::skipWhitespace() {
        while (true) {
            char c = peek();
            switch (c) {
                case '\n':
                    ++m_line;
                    // Fallthrough
                case ' ':
                case '\t':
                case '\r':
                    advance();
                    break;

                case '/':
                    if (peekNext() == '/') {
                        while (peek() != '\n' && !isAtEnd()) advance();
                    } else {
                        return;
                    }

                default:
                    return;
            }
        }
    }